

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obs2gal.cpp
# Opt level: O1

CEExecOptions * DefineOpts(void)

{
  CEExecOptions *in_RDI;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"obs2gal",(allocator *)&local_b0);
  CEExecOptions::CEExecOptions(in_RDI,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_b0);
  std::__cxx11::string::string((string *)&local_30);
  std::operator+(&local_90,&local_30,
                 "Takes observed positions (azimuth,zenith angle) and computes the ");
  std::operator+(&local_70,&local_90,
                 "Galactic longitude,latitude positions based on the observer location ");
  std::operator+(&local_50,&local_70,
                 "and atmospheric properties. The only values necessary to get rough ");
  std::operator+(&local_b0,&local_50,
                 "coordinates are \'longitude\', \'latitude\', \'azimuth\', \'zenith\', and ");
  std::operator+(&local_d0,&local_b0,"\'juliandate\'.");
  CLOptions::AddProgramDescription(&in_RDI->super_CLOptions,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_30);
  CEExecOptions::AddObserverPars(in_RDI);
  CEExecOptions::AddObservedPars(in_RDI);
  CEExecOptions::AddJDPar(in_RDI);
  return in_RDI;
}

Assistant:

CEExecOptions DefineOpts()
{
    CEExecOptions opts("obs2gal");

    // Add a program version and description
    opts.AddProgramDescription(std::string() +
        "Takes observed positions (azimuth,zenith angle) and computes the " +
        "Galactic longitude,latitude positions based on the observer location " +
        "and atmospheric properties. The only values necessary to get rough " +
        "coordinates are 'longitude', 'latitude', 'azimuth', 'zenith', and " +
        "'juliandate'.") ;
    
    // Setup the defaults
    opts.AddObserverPars();
    opts.AddObservedPars();
    opts.AddJDPar();

    return opts ;
}